

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::Half>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 Half min,Half max,float gridSize)

{
  bool bVar1;
  Half HVar2;
  char *pcVar3;
  float fVar4;
  float fVar5;
  int local_c4;
  int i_1;
  int i;
  Half local_9c;
  deFloat16 local_9a;
  deFloat16 local_98;
  deFloat16 local_96;
  Half local_94;
  deFloat16 local_92;
  deFloat16 local_90;
  deFloat16 local_8e;
  Half local_8c;
  Half local_8a;
  deFloat16 local_88;
  deFloat16 local_86;
  deFloat16 local_84;
  Half local_82;
  deFloat16 local_80;
  deFloat16 local_7e;
  deFloat16 local_7c;
  Half local_7a;
  Half local_78;
  deFloat16 local_76;
  deFloat16 local_74;
  deFloat16 local_72;
  Half local_70;
  deFloat16 local_6e;
  int local_6c;
  Half local_68;
  Half local_66;
  int attemptNdx;
  Half w;
  Half z;
  Half y2;
  Half y1;
  Half x2;
  Half x1;
  int quadNdx;
  undefined1 local_50 [4];
  Half minDiff;
  Half minQuadSize;
  deRandom rnd;
  char *_data;
  char *resultData;
  int quadStride;
  int componentStride;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  Half max_local;
  Half min_local;
  
  count_local._2_2_ = (Half)min.m_value;
  count_local._0_2_ = (Half)max.m_value;
  resultData._0_4_ = 0;
  gridSize_local = (float)stride;
  if (stride == 0) {
    gridSize_local = (float)(componentCount * 2);
  }
  if (primitive == PRIMITIVE_TRIANGLES) {
    resultData._0_4_ = (int)gridSize_local * 6;
  }
  pcVar3 = (char *)operator_new__((long)(offset + (int)resultData * count));
  deRandom_init((deRandom *)local_50,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar4 = gls::GLValue::Half::to<float>((Half *)&count_local);
    fVar5 = gls::GLValue::Half::to<float>((Half *)((long)&count_local + 2));
    fVar4 = deFloatAbs(fVar4 - fVar5);
    quadNdx._2_2_ = gls::GLValue::Half::fromFloat(fVar4 * gridSize);
    x1 = minValue<deqp::gls::GLValue::Half>();
    bVar1 = gls::GLValue::Half::operator>(&x1,(Half *)((long)&quadNdx + 2));
    if (bVar1) {
      quadNdx._0_2_ = minValue<deqp::gls::GLValue::Half>();
    }
    else {
      quadNdx._0_2_ = quadNdx._2_2_;
    }
    for (_y2 = 0; _y2 < count; _y2 = _y2 + 1) {
      for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
        local_72 = count_local._2_2_;
        local_74 = count_local._0_2_;
        local_70 = getRandom<deqp::gls::GLValue::Half>
                             ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
        local_6e = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_70);
        local_7a.m_value = quadNdx._0_2_;
        z.m_value = local_6e;
        local_7e = (deFloat16)gls::GLValue::Half::operator-((Half *)&count_local,&z);
        local_7c = (deFloat16)abs<deqp::gls::GLValue::Half>((Half)local_7e);
        local_78 = getRandom<deqp::gls::GLValue::Half>((deRandom *)local_50,local_7a,(Half)local_7c)
        ;
        local_76 = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_78);
        local_84 = count_local._2_2_;
        local_86 = count_local._0_2_;
        w.m_value = local_76;
        local_82 = getRandom<deqp::gls::GLValue::Half>
                             ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
        local_80 = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_82);
        local_8c.m_value = quadNdx._0_2_;
        attemptNdx._2_2_ = (Half)local_80;
        local_90 = (deFloat16)
                   gls::GLValue::Half::operator-
                             ((Half *)&count_local,(Half *)((long)&attemptNdx + 2));
        local_8e = (deFloat16)abs<deqp::gls::GLValue::Half>((Half)local_90);
        local_8a = getRandom<deqp::gls::GLValue::Half>((deRandom *)local_50,local_8c,(Half)local_8e)
        ;
        local_88 = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_8a);
        attemptNdx._0_2_ = (Half)local_88;
        if (componentCount < 3) {
          local_92 = (deFloat16)gls::GLValue::Half::create(0.0);
        }
        else {
          local_96 = count_local._2_2_;
          local_98 = count_local._0_2_;
          local_94 = getRandom<deqp::gls::GLValue::Half>
                               ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
          local_92 = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_94);
        }
        local_66.m_value = local_92;
        if (componentCount < 4) {
          local_9a = (deFloat16)gls::GLValue::Half::create(1.0);
        }
        else {
          local_9c = getRandom<deqp::gls::GLValue::Half>
                               ((deRandom *)local_50,count_local._2_2_,count_local._0_2_);
          local_9a = (deFloat16)roundTo<deqp::gls::GLValue::Half>((Half *)&quadNdx,&local_9c);
        }
        local_68.m_value = local_9a;
        if (componentCount < 3) break;
        fVar4 = gls::GLValue::Half::to<float>(&w);
        fVar5 = gls::GLValue::Half::to<float>(&local_66);
        fVar4 = deFloatAbs(fVar4 + fVar5);
        fVar5 = gls::GLValue::Half::to<float>((Half *)&quadNdx);
        if (fVar5 <= fVar4) {
          fVar4 = gls::GLValue::Half::to<float>((Half *)&attemptNdx);
          fVar5 = gls::GLValue::Half::to<float>(&local_68);
          fVar4 = deFloatAbs(fVar4 + fVar5);
          fVar5 = gls::GLValue::Half::to<float>((Half *)&quadNdx);
          if (fVar5 <= fVar4) break;
        }
      }
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData) + (long)offset,z);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + 2) + (long)offset,attemptNdx._2_2_);
      HVar2 = gls::GLValue::Half::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local) + (long)offset,HVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local + 2) + (long)offset,
                 attemptNdx._2_2_);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 2) + (long)offset,z);
      HVar2 = gls::GLValue::Half::operator+((Half *)((long)&attemptNdx + 2),(Half *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 2 + 2) + (long)offset
                 ,HVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 3) + (long)offset,z);
      HVar2 = gls::GLValue::Half::operator+((Half *)((long)&attemptNdx + 2),(Half *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 3 + 2) + (long)offset
                 ,HVar2);
      HVar2 = gls::GLValue::Half::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 4) + (long)offset,
                 HVar2);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 4 + 2) + (long)offset
                 ,attemptNdx._2_2_);
      HVar2 = gls::GLValue::Half::operator+(&z,&w);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 5) + (long)offset,
                 HVar2);
      HVar2 = gls::GLValue::Half::operator+((Half *)((long)&attemptNdx + 2),(Half *)&attemptNdx);
      alignmentSafeAssignment<deqp::gls::GLValue::Half>
                (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * 5 + 2) + (long)offset
                 ,HVar2);
      if (2 < componentCount) {
        for (i_1 = 0; i_1 < 6; i_1 = i_1 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::Half>
                    (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * i_1 + 4) +
                              (long)offset,local_66);
        }
      }
      if (3 < componentCount) {
        for (local_c4 = 0; local_c4 < 6; local_c4 = local_c4 + 1) {
          alignmentSafeAssignment<deqp::gls::GLValue::Half>
                    (pcVar3 + (long)(_y2 * (int)resultData + (int)gridSize_local * local_c4 + 6) +
                              (long)offset,local_68);
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}